

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void Diligent::PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::ShaderVkImpl>
               (RefCntAutoPtr<Diligent::ShaderVkImpl> *pShader,bool WaitForCompletion)

{
  ShaderVkImpl *pSVar1;
  SHADER_STATUS ShaderStatus;
  undefined7 in_register_00000031;
  Char *local_10;
  
  if (((int)CONCAT71(in_register_00000031,WaitForCompletion) != 0) &&
     (ShaderStatus = ShaderBase<Diligent::EngineVkImplTraits>::GetStatus
                               (&pShader->m_pObject->super_ShaderBase<Diligent::EngineVkImplTraits>,
                                true), ShaderStatus != SHADER_STATUS_READY)) {
    pSVar1 = pShader->m_pObject;
    local_10 = GetShaderStatusString(ShaderStatus,false);
    LogError<true,char[9],char_const*,char[9],char_const*,char[99]>
              (false,"WaitUntilShaderReadyIfRequested",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xbc,(char (*) [9])"Shader \'",
               (char **)&(pSVar1->super_ShaderBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                         .m_Desc,(char (*) [9])"\' is in ",&local_10,
               (char (*) [99])
               " status and cannot be used to create a pipeline state. Use GetStatus() to check the shader status."
              );
  }
  return;
}

Assistant:

void WaitUntilShaderReadyIfRequested(RefCntAutoPtr<ShaderImplType>& pShader, bool WaitForCompletion)
{
    if (WaitForCompletion)
    {
        const SHADER_STATUS ShaderStatus = pShader->GetStatus(/*WaitForCompletion = */ true);
        if (ShaderStatus != SHADER_STATUS_READY)
        {
            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' is in ", GetShaderStatusString(ShaderStatus),
                                " status and cannot be used to create a pipeline state. Use GetStatus() to check the shader status.");
        }
    }
}